

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCTest.cpp
# Opt level: O2

void RunScope(int count)

{
  int iVar1;
  Function *in_RAX;
  uint uVar2;
  bool bVar3;
  Function *local_38;
  
  local_38 = in_RAX;
  if (count < 1) {
    count = 0;
  }
  while (bVar3 = count != 0, count = count + -1, bVar3) {
    iVar1 = rand();
    if (iVar1 % 100 < 0xf) {
      RandomValue(false);
    }
    else {
      uVar2 = iVar1 % 100 + 1;
      if (uVar2 < 0x15) {
        local_38 = RandomFunction();
        std::deque<luna::Function*,std::allocator<luna::Function*>>::emplace_back<luna::Function*>
                  ((deque<luna::Function*,std::allocator<luna::Function*>> *)&g_globalFunction,
                   &local_38);
      }
      else if (uVar2 < 0x1f) {
        local_38 = (Function *)RandomString();
        std::deque<luna::String*,std::allocator<luna::String*>>::emplace_back<luna::String*>
                  ((deque<luna::String*,std::allocator<luna::String*>> *)&g_scopeString,
                   (String **)&local_38);
      }
      else if (uVar2 < 0x29) {
        local_38 = (Function *)RandomClosure();
        std::deque<luna::Closure*,std::allocator<luna::Closure*>>::emplace_back<luna::Closure*>
                  ((deque<luna::Closure*,std::allocator<luna::Closure*>> *)&g_scopeClosure,
                   (Closure **)&local_38);
      }
      else if (uVar2 < 0x33) {
        local_38 = (Function *)RandomTable();
        std::deque<luna::Table*,std::allocator<luna::Table*>>::emplace_back<luna::Table*>
                  ((deque<luna::Table*,std::allocator<luna::Table*>> *)&g_scopeTable,
                   (Table **)&local_38);
      }
      else if (uVar2 < 0x38) {
        NewObjInGlobal();
      }
    }
  }
  return;
}

Assistant:

void RunScope(int count)
{
    for (int i = 0; i < count; ++i)
    {
        int percent = RandomRange(1, 100);
        if (percent <= 15)
            RandomValue();
        else if (percent <= 20)
            g_globalFunction.push_back(RandomFunction());
        else if (percent <= 30)
            g_scopeString.push_back(RandomString());
        else if (percent <= 40)
            g_scopeClosure.push_back(RandomClosure());
        else if (percent <= 50)
            g_scopeTable.push_back(RandomTable());
        else if (percent <= 55)
            NewObjInGlobal();
    }
}